

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool i386_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  uint uVar1;
  bool bVar2;
  int flags;
  DisasContextBase *__mptr;
  DisasContext *dc;
  CPUBreakpoint *bp_local;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  uVar1 = 0x30;
  if ((dcbase->tb->flags & 0x10000) != 0) {
    uVar1 = 0x10;
  }
  bVar2 = (bp->flags & uVar1) != 0;
  if (bVar2) {
    gen_debug((DisasContext *)dcbase,dcbase->pc_next - *(long *)&dcbase[1].max_insns);
    dcbase->is_jmp = DISAS_NORETURN;
    dcbase->pc_next = dcbase->pc_next + 1;
  }
  return bVar2;
}

Assistant:

static bool i386_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                     const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);

    /* If RF is set, suppress an internally generated breakpoint.  */
    int flags = dc->base.tb->flags & HF_RF_MASK ? BP_GDB : BP_ANY;
    if (bp->flags & flags) {
        gen_debug(dc, dc->base.pc_next - dc->cs_base);
        dc->base.is_jmp = DISAS_NORETURN;
        /* The address covered by the breakpoint must be included in
           [tb->pc, tb->pc + tb->size) in order to for it to be
           properly cleared -- thus we increment the PC here so that
           the generic logic setting tb->size later does the right thing.  */
        dc->base.pc_next += 1;
        return true;
    } else {
        return false;
    }
}